

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O3

void __thiscall QtMWidgets::PageViewPrivate::preparePages(PageViewPrivate *this,QRect *r)

{
  int iVar1;
  int iVar2;
  
  iVar1 = PageControl::currentIndex(this->control);
  if (iVar1 != 0) {
    QWidget::move((QPoint *)(this->pages).d.ptr[(long)iVar1 + -1]);
    QWidget::show();
  }
  iVar2 = PageControl::count(this->control);
  if (iVar1 < iVar2 + -1) {
    QWidget::move((QPoint *)(this->pages).d.ptr[(long)iVar1 + 1]);
    QWidget::show();
  }
  QWidget::raise();
  this->pagesPrepared = true;
  return;
}

Assistant:

void
PageViewPrivate::preparePages( const QRect & r )
{
	const int index = control->currentIndex();

	if( index != 0 )
	{
		QWidget * w = pages.at( index - 1 );

		QRect left = r;
		left.moveLeft( r.x() - r.width() );

		w->move( left.topLeft() );

		w->show();
	}

	if( index < control->count() - 1 )
	{
		QWidget * w = pages.at( index + 1 );

		const QRect right( r.x() + r.width(), r.y(), r.width(), r.height() );

		w->move( right.topLeft() );

		w->show();
	}

	control->raise();

	pagesPrepared = true;
}